

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::CodedOutputStreamFieldSkipper::SkipUnknownEnum
          (CodedOutputStreamFieldSkipper *this,int field_number,int value)

{
  CodedOutputStream *pCVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar1 = this->unknown_fields_;
  if (pCVar1->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(pCVar1,field_number);
  }
  else {
    pbVar2 = pCVar1->buffer_;
    pbVar5 = pbVar2;
    if ((uint)field_number < 0x80) {
      uVar6 = (ulong)(uint)field_number;
    }
    else {
      uVar6 = (ulong)(uint)field_number;
      do {
        *pbVar5 = (byte)field_number | 0x80;
        uVar6 = uVar6 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < (uint)field_number;
        field_number = (uint)uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar2) + 1;
    pCVar1->buffer_ = pCVar1->buffer_ + iVar4;
    pCVar1->buffer_size_ = pCVar1->buffer_size_ - iVar4;
  }
  pCVar1 = this->unknown_fields_;
  uVar6 = (ulong)value;
  if (pCVar1->buffer_size_ < 10) {
    io::CodedOutputStream::WriteVarint64SlowPath(pCVar1,uVar6);
    return;
  }
  pbVar2 = pCVar1->buffer_;
  pbVar5 = pbVar2;
  uVar7 = uVar6;
  if (0x7f < (uint)value) {
    do {
      *pbVar5 = (byte)uVar7 | 0x80;
      uVar6 = uVar7 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar3 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar3);
  }
  *pbVar5 = (byte)uVar6;
  iVar4 = ((int)pbVar5 - (int)pbVar2) + 1;
  pCVar1->buffer_ = pCVar1->buffer_ + iVar4;
  pCVar1->buffer_size_ = pCVar1->buffer_size_ - iVar4;
  return;
}

Assistant:

void CodedOutputStreamFieldSkipper::SkipUnknownEnum(
    int field_number, int value) {
  unknown_fields_->WriteVarint32(field_number);
  unknown_fields_->WriteVarint64(value);
}